

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctstr_iendswith(char *str,char *check)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  
  if (str != (char *)0x0 || check != (char *)0x0) {
    if ((str == (char *)0x0) != (check == (char *)0x0)) {
      return 0;
    }
    sVar3 = strlen(check);
    sVar4 = strlen(str);
    if (sVar4 < sVar3) {
      return 0;
    }
    for (lVar5 = 0; -lVar5 != sVar3; lVar5 = lVar5 + -1) {
      iVar1 = tolower((int)str[lVar5 + sVar4]);
      iVar2 = tolower((int)check[lVar5 + sVar3]);
      if (iVar1 != iVar2) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int
fctstr_iendswith(char const *str, char const *check)
{
    size_t check_i;
    size_t str_i;
    if ( str == NULL && check == NULL )
    {
        return 1;
    }
    else if ( ((str == NULL) && (check != NULL))
              || ((str != NULL) && (check == NULL)) )
    {
        return 0;
    }
    check_i = strlen(check);
    str_i = strlen(str);
    if ( str_i < check_i )
    {
        return 0;   /* Can't do it string is too small. */
    }
    for ( ; check_i != 0; --check_i, --str_i)
    {
        if ( tolower(str[str_i]) != tolower(check[check_i]) )
        {
            return 0; /* Found a case where they are not equal. */
        }
    }
    /* Exhausted check against string, can only be true. */
    return 1;
}